

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_derive.cpp
# Opt level: O0

void pelelm_mgvort(Box *bx,FArrayBox *derfab,int dcomp,int param_4,FArrayBox *datfab,
                  Geometry *geomdata,Real param_7,int *param_8,int param_9)

{
  int in_EDX;
  long in_RSI;
  EBFArrayBox *in_R8;
  CoordSys *in_R9;
  Array4<const_amrex::EBCellFlag> *flag_fab;
  FabType typ;
  EBCellFlagFab *flags;
  EBFArrayBox *ebfab;
  Array4<double> *vort_arr;
  Array4<const_double> *dat_arr;
  Real idz;
  Real idy;
  Real idx;
  undefined1 local_630 [40];
  anon_class_216_6_d1ab189f *in_stack_fffffffffffff9f8;
  Box *in_stack_fffffffffffffa00;
  undefined1 auStack_5d8 [64];
  undefined1 local_598 [64];
  undefined1 auStack_558 [40];
  Box *in_stack_fffffffffffffad0;
  EBCellFlagFab *in_stack_fffffffffffffad8;
  undefined1 auStack_518 [64];
  Real local_4d8;
  Real local_4d0;
  Real local_4c8;
  Array4<const_amrex::EBCellFlag> local_4c0;
  Array4<const_amrex::EBCellFlag> *local_480;
  undefined1 local_478 [68];
  FabType local_434;
  EBCellFlagFab *local_430;
  EBFArrayBox *local_428;
  Array4<double> local_420;
  Array4<double> *local_3e0;
  Array4<const_double> local_3d8;
  Array4<const_double> *local_398;
  Real local_390;
  Real local_388;
  Real local_380;
  CoordSys *local_370;
  EBFArrayBox *local_368;
  int local_35c;
  long local_358;
  Array4<double> local_348;
  int local_304;
  long local_300;
  EBFArrayBox *local_2f8;
  EBCellFlagFab *local_2f0;
  Dim3 local_2e8;
  Dim3 local_2d8;
  Dim3 local_2c8;
  Dim3 local_2b8;
  int local_2ac;
  Box *local_2a8;
  double *local_2a0;
  Dim3 local_298;
  Box *local_288;
  int local_27c;
  int iStack_278;
  int local_274;
  Dim3 local_270;
  Box *local_260;
  int local_258;
  int iStack_254;
  int local_250;
  undefined4 local_24c;
  IntVect *local_248;
  undefined4 local_23c;
  IntVect *local_238;
  undefined4 local_22c;
  IntVect *local_228;
  undefined4 local_21c;
  Box *local_218;
  undefined4 local_20c;
  Box *local_208;
  undefined4 local_1fc;
  Box *local_1f8;
  Dim3 local_1f0;
  Dim3 local_1dc;
  Dim3 local_1d0;
  Dim3 local_1c0;
  int local_1b4;
  undefined8 *local_1b0;
  double *local_1a8;
  Dim3 local_1a0;
  undefined8 *local_190;
  undefined4 local_184;
  undefined4 uStack_180;
  int local_17c;
  Dim3 local_178;
  undefined8 *local_168;
  int local_160;
  int iStack_15c;
  int local_158;
  undefined4 local_154;
  long local_150;
  undefined4 local_144;
  long local_140;
  undefined4 local_134;
  int *local_130;
  undefined4 local_124;
  undefined8 *local_120;
  undefined4 local_114;
  undefined8 *local_110;
  undefined4 local_104;
  undefined8 *local_100;
  Dim3 local_f8;
  Dim3 local_e4;
  Dim3 local_d8;
  Dim3 local_c8;
  int local_bc;
  Box *local_b8;
  EBCellFlag *local_b0;
  Dim3 local_a8;
  Box *local_98;
  int local_8c;
  int iStack_88;
  int local_84;
  Dim3 local_80;
  Box *local_70;
  int local_68;
  int iStack_64;
  int local_60;
  undefined4 local_5c;
  IntVect *local_58;
  undefined4 local_4c;
  IntVect *local_48;
  undefined4 local_3c;
  IntVect *local_38;
  undefined4 local_2c;
  Box *local_28;
  undefined4 local_1c;
  Box *local_18;
  undefined4 local_c;
  Box *local_8;
  
  local_370 = in_R9;
  local_368 = in_R8;
  local_35c = in_EDX;
  local_358 = in_RSI;
  local_380 = amrex::CoordSys::InvCellSize(in_R9,0);
  local_388 = amrex::CoordSys::InvCellSize(local_370,1);
  local_390 = amrex::CoordSys::InvCellSize(local_370,2);
  local_2f8 = local_368;
  local_2a0 = (local_368->super_FArrayBox).super_BaseFab<double>.dptr;
  local_2a8 = &(local_368->super_FArrayBox).super_BaseFab<double>.domain;
  local_2ac = (local_368->super_FArrayBox).super_BaseFab<double>.nvar;
  local_1fc = 0;
  local_27c = (local_2a8->smallend).vect[0];
  local_20c = 1;
  iStack_278 = (local_368->super_FArrayBox).super_BaseFab<double>.domain.smallend.vect[1];
  local_2c8.x = (local_2a8->smallend).vect[0];
  local_2c8.y = (local_2a8->smallend).vect[1];
  local_21c = 2;
  local_2c8.z = (local_368->super_FArrayBox).super_BaseFab<double>.domain.smallend.vect[2];
  local_228 = &(local_368->super_FArrayBox).super_BaseFab<double>.domain.bigend;
  local_22c = 0;
  local_258 = local_228->vect[0] + 1;
  local_238 = &(local_368->super_FArrayBox).super_BaseFab<double>.domain.bigend;
  local_23c = 1;
  iStack_254 = (local_368->super_FArrayBox).super_BaseFab<double>.domain.bigend.vect[1] + 1;
  local_248 = &(local_368->super_FArrayBox).super_BaseFab<double>.domain.bigend;
  local_24c = 2;
  local_2e8.z = (local_368->super_FArrayBox).super_BaseFab<double>.domain.bigend.vect[2] + 1;
  local_2e8.y = iStack_254;
  local_2e8.x = local_258;
  local_2d8._0_8_ = local_2e8._0_8_;
  local_2d8.z = local_2e8.z;
  local_2b8._0_8_ = local_2c8._0_8_;
  local_2b8.z = local_2c8.z;
  local_298._0_8_ = local_2c8._0_8_;
  local_298.z = local_2c8.z;
  local_288 = local_2a8;
  local_274 = local_2c8.z;
  local_270._0_8_ = local_2e8._0_8_;
  local_270.z = local_2e8.z;
  local_260 = local_2a8;
  local_250 = local_2e8.z;
  local_218 = local_2a8;
  local_208 = local_2a8;
  local_1f8 = local_2a8;
  amrex::Array4<const_double>::Array4(&local_3d8,local_2a0,&local_2b8,&local_2d8,local_2ac);
  local_300 = local_358;
  local_304 = local_35c;
  local_1a8 = *(double **)(local_358 + 0x10);
  local_1b0 = (undefined8 *)(local_358 + 0x18);
  local_1b4 = *(int *)(local_358 + 0x34);
  local_104 = 0;
  local_184 = *(undefined4 *)local_1b0;
  local_114 = 1;
  uStack_180 = *(undefined4 *)(local_358 + 0x1c);
  local_1d0._0_8_ = *local_1b0;
  local_124 = 2;
  local_1d0.z = *(int *)(local_358 + 0x20);
  local_130 = (int *)(local_358 + 0x24);
  local_134 = 0;
  local_160 = *local_130 + 1;
  local_140 = local_358 + 0x24;
  local_144 = 1;
  iStack_15c = *(int *)(local_358 + 0x28) + 1;
  local_150 = local_358 + 0x24;
  local_154 = 2;
  local_1f0.z = *(int *)(local_358 + 0x2c) + 1;
  local_1f0.y = iStack_15c;
  local_1f0.x = local_160;
  local_398 = &local_3d8;
  local_1dc._0_8_ = local_1f0._0_8_;
  local_1dc.z = local_1f0.z;
  local_1c0._0_8_ = local_1d0._0_8_;
  local_1c0.z = local_1d0.z;
  local_1a0._0_8_ = local_1d0._0_8_;
  local_1a0.z = local_1d0.z;
  local_190 = local_1b0;
  local_17c = local_1d0.z;
  local_178._0_8_ = local_1f0._0_8_;
  local_178.z = local_1f0.z;
  local_168 = local_1b0;
  local_158 = local_1f0.z;
  local_120 = local_1b0;
  local_110 = local_1b0;
  local_100 = local_1b0;
  amrex::Array4<double>::Array4(&local_348,local_1a8,&local_1c0,&local_1dc,local_1b4);
  amrex::Array4<double>::Array4<double,_0>(&local_420,&local_348,local_304);
  local_3e0 = &local_420;
  local_428 = local_368;
  local_430 = amrex::EBFArrayBox::getEBCellFlagFab(local_368);
  local_434 = amrex::EBCellFlagFab::getType(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  if (local_434 == covered) {
    memcpy(local_478,local_3e0,0x3c);
    amrex::
    ParallelFor<pelelm_mgvort(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::FArrayBox_const&,amrex::Geometry_const&,double,int_const*,int)::__0>
              (in_stack_fffffffffffffa00,(anon_class_64_1_82a24c5b *)in_stack_fffffffffffff9f8);
  }
  else if (local_434 == singlevalued) {
    local_2f0 = local_430;
    local_b0 = (local_430->super_BaseFab<amrex::EBCellFlag>).dptr;
    local_b8 = &(local_430->super_BaseFab<amrex::EBCellFlag>).domain;
    local_bc = (local_430->super_BaseFab<amrex::EBCellFlag>).nvar;
    local_c = 0;
    local_8c = (local_b8->smallend).vect[0];
    local_1c = 1;
    iStack_88 = (local_430->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
    local_d8.x = (local_b8->smallend).vect[0];
    local_d8.y = (local_b8->smallend).vect[1];
    local_2c = 2;
    local_d8.z = (local_430->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
    local_38 = &(local_430->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
    local_3c = 0;
    local_68 = local_38->vect[0] + 1;
    local_48 = &(local_430->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
    local_4c = 1;
    iStack_64 = (local_430->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
    local_58 = &(local_430->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
    local_5c = 2;
    local_f8.z = (local_430->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
    local_f8.y = iStack_64;
    local_f8.x = local_68;
    local_e4._0_8_ = local_f8._0_8_;
    local_e4.z = local_f8.z;
    local_c8._0_8_ = local_d8._0_8_;
    local_c8.z = local_d8.z;
    local_a8._0_8_ = local_d8._0_8_;
    local_a8.z = local_d8.z;
    local_98 = local_b8;
    local_84 = local_d8.z;
    local_80._0_8_ = local_f8._0_8_;
    local_80.z = local_f8.z;
    local_70 = local_b8;
    local_60 = local_f8.z;
    local_28 = local_b8;
    local_18 = local_b8;
    local_8 = local_b8;
    amrex::Array4<const_amrex::EBCellFlag>::Array4(&local_4c0,local_b0,&local_c8,&local_e4,local_bc)
    ;
    local_480 = &local_4c0;
    memcpy(local_598,local_480,0x3c);
    memcpy(auStack_558,local_3e0,0x3c);
    memcpy(auStack_518,local_398,0x3c);
    local_4d8 = local_380;
    local_4d0 = local_388;
    local_4c8 = local_390;
    amrex::
    ParallelFor<pelelm_mgvort(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::FArrayBox_const&,amrex::Geometry_const&,double,int_const*,int)::__1>
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  }
  else {
    memcpy(local_630,local_398,0x3c);
    memcpy(auStack_5d8,local_3e0,0x3c);
    amrex::
    ParallelFor<pelelm_mgvort(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::FArrayBox_const&,amrex::Geometry_const&,double,int_const*,int)::__2>
              (in_stack_fffffffffffffa00,(anon_class_152_5_955fce60 *)in_stack_fffffffffffff9f8);
  }
  return;
}

Assistant:

void pelelm_mgvort (const Box& bx, FArrayBox& derfab, int dcomp, int /*ncomp*/,
                    const FArrayBox& datfab, const Geometry& geomdata,
                    Real /*time*/, const int* /*bcrec*/, int /*level*/)

{
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(datfab.box().contains(bx));

    AMREX_D_TERM(const amrex::Real idx = geomdata.InvCellSize(0);,
                 const amrex::Real idy = geomdata.InvCellSize(1);,
                 const amrex::Real idz = geomdata.InvCellSize(2););

    amrex::Array4<amrex::Real const> const& dat_arr = datfab.const_array();
    amrex::Array4<amrex::Real>       const&vort_arr = derfab.array(dcomp);

#ifdef AMREX_USE_EB
    const EBFArrayBox& ebfab = static_cast<EBFArrayBox const&>(datfab);
    const EBCellFlagFab& flags = ebfab.getEBCellFlagFab();
    auto typ = flags.getType(bx);
    if (typ == FabType::covered)
    {
        amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            vort_arr(i,j,k) = 0.0;
        });
    } else if (typ == FabType::singlevalued)
    {
       const auto& flag_fab = flags.const_array();
       amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
       {
          constexpr amrex::Real c0 = -1.5;
          constexpr amrex::Real c1 = 2.0;
          constexpr amrex::Real c2 = -0.5;
          if (flag_fab(i,j,k).isCovered()) {
             vort_arr(i,j,k) = 0.0;
          } else {
             amrex::Real vx = 0.0;
             amrex::Real uy = 0.0;
#if ( AMREX_SPACEDIM == 2 )
             // Need to check if there are covered cells in neighbours --
             // -- if so, use one-sided difference computation (but still quadratic)
             if (!flag_fab(i,j,k).isConnected( 1,0,0)) {
                vx = - (c0 * dat_arr(i  ,j,k,1)
                      + c1 * dat_arr(i-1,j,k,1)
                      + c2 * dat_arr(i-2,j,k,1)) * idx;
             } else if (!flag_fab(i,j,k).isConnected(-1,0,0)) {
                vx = (c0 * dat_arr(i  ,j,k,1)
                    + c1 * dat_arr(i+1,j,k,1)
                    + c2 * dat_arr(i+2,j,k,1)) * idx;
             } else {
                vx = 0.5 * (dat_arr(i+1,j,k,1) - dat_arr(i-1,j,k,1)) * idx;
             }
             // Do the same in y-direction
             if (!flag_fab(i,j,k).isConnected( 0,1,0)) {
                uy = - (c0 * dat_arr(i,j  ,k,0)
                      + c1 * dat_arr(i,j-1,k,0)
                      + c2 * dat_arr(i,j-2,k,0)) * idy;
             } else if (!flag_fab(i,j,k).isConnected(0,-1,0)) {
                uy = (c0 * dat_arr(i,j  ,k,0)
                    + c1 * dat_arr(i,j+1,k,0)
                    + c2 * dat_arr(i,j+2,k,0)) * idy;
             } else {
                uy = 0.5 * (dat_arr(i,j+1,k,0) - dat_arr(i,j-1,k,0)) * idy;
             }
             vort_arr(i,j,k) = vx-uy;
#elif ( AMREX_SPACEDIM == 3 )
             amrex::Real wx = 0.0;
             amrex::Real wy = 0.0;
             amrex::Real uz = 0.0;
             amrex::Real vz = 0.0;
             // Need to check if there are covered cells in neighbours --
             // -- if so, use one-sided difference computation (but still quadratic)
             if (!flag_fab(i,j,k).isConnected( 1,0,0)) {
                // Covered cell to the right, go fish left
                vx = - (c0 * dat_arr(i  ,j,k,1)
                      + c1 * dat_arr(i-1,j,k,1)
                      + c2 * dat_arr(i-2,j,k,1)) * idx;
                wx = - (c0 * dat_arr(i  ,j,k,2)
                      + c1 * dat_arr(i-1,j,k,2)
                      + c2 * dat_arr(i-2,j,k,2)) * idx;
             } else if (!flag_fab(i,j,k).isConnected(-1,0,0)) {
                // Covered cell to the left, go fish right
                vx = (c0 * dat_arr(i  ,j,k,1)
                    + c1 * dat_arr(i+1,j,k,1)
                    + c2 * dat_arr(i+2,j,k,1)) * idx;
                wx = (c0 * dat_arr(i  ,j,k,2)
                    + c1 * dat_arr(i+1,j,k,2)
                    + c2 * dat_arr(i+2,j,k,2)) * idx;
             } else {
                // No covered cells right or left, use standard stencil
                vx = 0.5 * (dat_arr(i+1,j,k,1) - dat_arr(i-1,j,k,1)) * idx;
                wx = 0.5 * (dat_arr(i+1,j,k,2) - dat_arr(i-1,j,k,2)) * idx;
             }
             // Do the same in y-direction
             if (!flag_fab(i,j,k).isConnected(0, 1,0)) {
                 uy = - (c0 * dat_arr(i,j  ,k,0)
                       + c1 * dat_arr(i,j-1,k,0)
                       + c2 * dat_arr(i,j-2,k,0)) * idy;
                 wy = - (c0 * dat_arr(i,j  ,k,2)
                       + c1 * dat_arr(i,j-1,k,2)
                       + c2 * dat_arr(i,j-2,k,2)) * idy;
             } else if (!flag_fab(i,j,k).isConnected(0,-1,0)) {
                 uy = (c0 * dat_arr(i,j  ,k,0)
                     + c1 * dat_arr(i,j+1,k,0)
                     + c2 * dat_arr(i,j+2,k,0)) * idy;
                 wy = (c0 * dat_arr(i,j  ,k,2)
                     + c1 * dat_arr(i,j+1,k,2)
                     + c2 * dat_arr(i,j+2,k,2)) * idy;
             } else {
                 uy = 0.5 * (dat_arr(i,j+1,k,0) - dat_arr(i,j-1,k,0)) * idy;
                 wy = 0.5 * (dat_arr(i,j+1,k,2) - dat_arr(i,j-1,k,2)) * idy;
             }
             // Do the same in z-direction
             if (!flag_fab(i,j,k).isConnected(0,0, 1)) {
                 uz = - (c0 * dat_arr(i,j,k  ,0)
                       + c1 * dat_arr(i,j,k-1,0)
                       + c2 * dat_arr(i,j,k-2,0)) * idz;
                 vz = - (c0 * dat_arr(i,j,k  ,1)
                       + c1 * dat_arr(i,j,k-1,1)
                       + c2 * dat_arr(i,j,k-2,1)) * idz;
             } else if (!flag_fab(i,j,k).isConnected(0,0,-1)) {
                 uz = (c0 * dat_arr(i,j,k  ,0)
                     + c1 * dat_arr(i,j,k+1,0)
                     + c2 * dat_arr(i,j,k+2,0)) * idz;
                 vz = (c0 * dat_arr(i,j,k  ,1)
                     + c1 * dat_arr(i,j,k+1,1)
                     + c2 * dat_arr(i,j,k+2,1)) * idz;
             } else {
                 uz = 0.5 * (dat_arr(i,j,k+1,0) - dat_arr(i,j,k-1,0)) * idz;
                 vz = 0.5 * (dat_arr(i,j,k+1,1) - dat_arr(i,j,k-1,1)) * idz;
             }
             vort_arr(i,j,k) = std::sqrt((wy-vz)*(wy-vz) + (uz-wx)*(uz-wx) + (vx-uy)*(vx-uy));
#endif
          }
       });
    } else
#endif
    {
        amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
#if ( AMREX_SPACEDIM == 2 )
            amrex::Real vx = 0.5 * (dat_arr(i+1,j,k,1) - dat_arr(i-1,j,k,1)) * idx;
            amrex::Real uy = 0.5 * (dat_arr(i,j+1,k,0) - dat_arr(i,j-1,k,0)) * idy;
            vort_arr(i,j,k) = vx-uy;

#elif ( AMREX_SPACEDIM == 3 )
            amrex::Real vx = 0.5 * (dat_arr(i+1,j,k,1) - dat_arr(i-1,j,k,1)) * idx;
            amrex::Real wx = 0.5 * (dat_arr(i+1,j,k,2) - dat_arr(i-1,j,k,2)) * idx;

            amrex::Real uy = 0.5 * (dat_arr(i,j+1,k,0) - dat_arr(i,j-1,k,0)) * idy;
            amrex::Real wy = 0.5 * (dat_arr(i,j+1,k,2) - dat_arr(i,j-1,k,2)) * idy;

            amrex::Real uz = 0.5 * (dat_arr(i,j,k+1,0) - dat_arr(i,j,k-1,0)) * idz;
            amrex::Real vz = 0.5 * (dat_arr(i,j,k+1,1) - dat_arr(i,j,k-1,1)) * idz;

            vort_arr(i,j,k) = std::sqrt((wy-vz)*(wy-vz) + (uz-wx)*(uz-wx) + (vx-uy)*(vx-uy));
#endif
        });
    }
}